

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_set::build_graph(test_set *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  reference pvVar2;
  ggml_tensor *pgVar3;
  const_reference pvVar4;
  ggml_context *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  int i_1;
  size_t offset;
  ggml_tensor *dst;
  int i;
  array<long,_4UL> ne_dst;
  ggml_tensor *src;
  size_type in_stack_ffffffffffffff68;
  array<long,_4UL> *in_stack_ffffffffffffff70;
  int64_t *in_stack_ffffffffffffff78;
  ggml_context *ne;
  int in_stack_ffffffffffffff80;
  ggml_type in_stack_ffffffffffffff84;
  ggml_type type;
  ggml_context *ctx_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar5;
  int local_54;
  long local_50;
  int local_3c;
  
  uVar5 = *(undefined4 *)(in_RDI + 0x38);
  ctx_00 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x190331);
  pgVar1 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(uVar5,in_stack_ffffffffffffff90),ctx_00,
                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
  ;
  ggml_set_param(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"src");
  for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x60); local_3c = local_3c + 1) {
    pvVar2 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    *pvVar2 = *pvVar2 << 1;
  }
  type = *(ggml_type *)(in_RDI + 0x3c);
  ne = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x190404);
  pgVar3 = test_case::ggml_new_tensor
                     ((test_case *)CONCAT44(uVar5,in_stack_ffffffffffffff90),ctx_00,type,
                      in_stack_ffffffffffffff80,(int64_t *)ne);
  ggml_set_param(in_RSI,pgVar3);
  ggml_set_name(pgVar3,"dst");
  local_50 = 0;
  for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x60); local_54 = local_54 + 1) {
    pvVar2 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff70 = (array<long,_4UL> *)*pvVar2;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_50 = (((long)in_stack_ffffffffffffff70 - *pvVar4) / 2) * pgVar3->nb[local_54] + local_50;
  }
  pgVar1 = (ggml_tensor *)
           ggml_set(in_RSI,pgVar3,pgVar1,pgVar1->nb[1],pgVar1->nb[2],pgVar1->nb[3],local_50);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * src = ggml_new_tensor(ctx, type_src, 4, ne.data());
        ggml_set_param(ctx, src);
        ggml_set_name(src, "src");

        auto ne_dst = ne;
        for (int i = 0; i < dim; ++i) {
            ne_dst[i] *= 2;
        }
        ggml_tensor* dst = ggml_new_tensor(ctx, type_dst, 4, ne_dst.data());
        ggml_set_param(ctx, dst);
        ggml_set_name(dst, "dst");

        size_t offset = 0;
        for (int i = 0; i < dim; ++i) {
            offset += ((ne_dst[i] - ne[i])/2)*dst->nb[i];
        }
        ggml_tensor * out = ggml_set(ctx, dst, src,
            // The backward pass requires setting a contiguous region:
            src->nb[1], src->nb[2], src->nb[3], offset);
        ggml_set_name(out, "out");

        return out;
    }